

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprIsTableConstraint(Expr *pExpr,SrcItem *pSrc)

{
  int iVar1;
  SrcItem *pSrc_local;
  Expr *pExpr_local;
  
  if (((pSrc->fg).jointype & 0x40) != 0) {
    return 0;
  }
  if (((pSrc->fg).jointype & 8) == 0) {
    if ((pExpr->flags & 1) != 0) {
      return 0;
    }
  }
  else {
    if ((pExpr->flags & 1) == 0) {
      return 0;
    }
    if ((pExpr->w).iJoin != pSrc->iCursor) {
      return 0;
    }
  }
  iVar1 = sqlite3ExprIsTableConstant(pExpr,pSrc->iCursor);
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprIsTableConstraint(Expr *pExpr, const SrcItem *pSrc){
  if( pSrc->fg.jointype & JT_LTORJ ){
    return 0;  /* rule (3) */
  }
  if( pSrc->fg.jointype & JT_LEFT ){
    if( !ExprHasProperty(pExpr, EP_OuterON) ) return 0;   /* rule (4a) */
    if( pExpr->w.iJoin!=pSrc->iCursor ) return 0;         /* rule (4b) */
  }else{
    if( ExprHasProperty(pExpr, EP_OuterON) ) return 0;    /* rule (5) */
  }
  return sqlite3ExprIsTableConstant(pExpr, pSrc->iCursor); /* rules (1), (2) */
}